

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O3

int Assimp::FBX::ParseTokenAsInt(Token *t,char **err_out)

{
  char cVar1;
  int iVar2;
  char cVar3;
  char *data;
  char *pcVar4;
  int iVar5;
  
  *err_out = (char *)0x0;
  if (t->type == TokenType_DATA) {
    pcVar4 = t->sbegin;
    cVar1 = *pcVar4;
    if (t->column == 0xffffffff) {
      if (cVar1 == 'I') {
        return *(int *)(pcVar4 + 1);
      }
      pcVar4 = "failed to parse I(nt), unexpected data type (binary)";
    }
    else {
      pcVar4 = pcVar4 + ((cVar1 - 0x2bU & 0xfd) == 0);
      cVar3 = *pcVar4;
      iVar5 = 0;
      if (0xf5 < (byte)(cVar3 - 0x3aU)) {
        iVar5 = 0;
        do {
          iVar5 = (uint)(byte)(cVar3 - 0x30) + iVar5 * 10;
          cVar3 = pcVar4[1];
          pcVar4 = pcVar4 + 1;
        } while (0xf5 < (byte)(cVar3 - 0x3aU));
      }
      iVar2 = -iVar5;
      if (cVar1 != '-') {
        iVar2 = iVar5;
      }
      if (pcVar4 == t->send) {
        return iVar2;
      }
      pcVar4 = "failed to parse ID";
    }
  }
  else {
    pcVar4 = "expected TOK_DATA token";
  }
  *err_out = pcVar4;
  return 0;
}

Assistant:

int ParseTokenAsInt(const Token& t, const char*& err_out)
{
    err_out = NULL;

    if (t.Type() != TokenType_DATA) {
        err_out = "expected TOK_DATA token";
        return 0;
    }

    if(t.IsBinary())
    {
        const char* data = t.begin();
        if (data[0] != 'I') {
            err_out = "failed to parse I(nt), unexpected data type (binary)";
            return 0;
        }

        BE_NCONST int32_t ival = SafeParse<int32_t>(data+1, t.end());
        AI_SWAP4(ival);
        return static_cast<int>(ival);
    }

    ai_assert(static_cast<size_t>(t.end() - t.begin()) > 0);

    const char* out;
    const int intval = strtol10(t.begin(),&out);
    if (out != t.end()) {
        err_out = "failed to parse ID";
        return 0;
    }

    return intval;
}